

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void vector_int(void)

{
  initializer_list<int> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Assert local_1c0;
  vector<int,_std::allocator<int>_> s;
  stringstream ss;
  ostream local_188 [384];
  
  _ss = 0x100000000;
  __l._M_len = 4;
  __l._M_array = (iterator)&ss;
  std::vector<int,_std::allocator<int>_>::vector(&s,__l,(allocator_type *)&local_1e0);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_1e0._M_dataplus._M_p = (pointer)&s;
  UnitTests::stream_any_details::operator<<
            (local_188,(outputter<std::vector<int,_std::allocator<int>_>_> *)&local_1e0);
  local_1c0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1c0.m_line = 0x62;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1c0,(char (*) [15])"[0, 1, 2, 156]",&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&s.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(vector_int)
{
    auto s  = std::vector<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}